

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolver.cpp
# Opt level: O1

void __thiscall HighsMipSolver::callbackGetCutPool(HighsMipSolver *this)

{
  HighsCallback *pHVar1;
  HighsCallback *pHVar2;
  HighsInt HVar3;
  vector<double,_std::allocator<double>_> cut_upper;
  vector<double,_std::allocator<double>_> cut_lower;
  HighsSparseMatrix cut_matrix;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  HighsSparseMatrix local_88;
  
  pHVar1 = this->callback_;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HighsSparseMatrix::HighsSparseMatrix(&local_88);
  HighsLpRelaxation::getCutPool
            (&((this->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->lp,
             &(pHVar1->data_out).cutpool_num_col,&(pHVar1->data_out).cutpool_num_cut,&local_c8,
             &local_e8,&local_88);
  HVar3 = HighsSparseMatrix::numNz(&local_88);
  (pHVar1->data_out).cutpool_num_nz = HVar3;
  (pHVar1->data_out).cutpool_start =
       local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start;
  (pHVar1->data_out).cutpool_index =
       local_88.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start;
  (pHVar1->data_out).cutpool_value =
       local_88.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pHVar1->data_out).cutpool_lower =
       local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (pHVar1->data_out).cutpool_upper =
       local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  pHVar1 = this->callback_;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MIP cut pool","");
  pHVar2 = this->callback_;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator()(&pHVar1->user_callback,7,&local_a8,&pHVar2->data_out,
               (anon_struct_16_2_bb6a87e9 *)&pHVar2->data_in,pHVar2->user_callback_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_88.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double *)0x0) {
    operator_delete(local_88.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (HighsInt *)0x0) {
    operator_delete(local_88.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (HighsInt *)0x0) {
    operator_delete(local_88.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsMipSolver::callbackGetCutPool() const {
  assert(callback_->user_callback);
  assert(callback_->callbackActive(kCallbackMipGetCutPool));
  HighsCallbackDataOut& data_out = callback_->data_out;

  std::vector<double> cut_lower;
  std::vector<double> cut_upper;
  HighsSparseMatrix cut_matrix;

  mipdata_->lp.getCutPool(data_out.cutpool_num_col, data_out.cutpool_num_cut,
                          cut_lower, cut_upper, cut_matrix);

  data_out.cutpool_num_nz = cut_matrix.numNz();
  data_out.cutpool_start = cut_matrix.start_.data();
  data_out.cutpool_index = cut_matrix.index_.data();
  data_out.cutpool_value = cut_matrix.value_.data();
  data_out.cutpool_lower = cut_lower.data();
  data_out.cutpool_upper = cut_upper.data();
  callback_->user_callback(kCallbackMipGetCutPool, "MIP cut pool",
                           &callback_->data_out, &callback_->data_in,
                           callback_->user_callback_data);
}